

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall
testing::Action<bool_(unsigned_short)>::Perform
          (Action<bool_(unsigned_short)> *this,ArgumentTuple *args)

{
  bool bVar1;
  ArgumentTuple *args_local;
  Action<bool_(unsigned_short)> *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  bVar1 = internal::Apply<std::function<bool(unsigned_short)>const&,std::tuple<unsigned_short>>
                    (&this->fun_,args);
  return bVar1;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }